

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleinterp.cpp
# Opt level: O2

void __thiscall BrainFuckInterpreter::~BrainFuckInterpreter(BrainFuckInterpreter *this)

{
  if (this->tape_ != (uint8_t *)0x0) {
    operator_delete__(this->tape_);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~BrainFuckInterpreter() {
        delete []tape_;
    }